

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF.cc
# Opt level: O1

void __thiscall
QPDF::processFile(QPDF *this,char *description,FILE *filep,bool close_file,char *password)

{
  _Head_base<0UL,_QPDF::Members_*,_false> _Var1;
  FileInputSource *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  this_00 = (FileInputSource *)operator_new(0xd8);
  FileInputSource::FileInputSource(this_00,description,filep,close_file);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<FileInputSource*>
            (&local_38,this_00);
  _Var1._M_head_impl =
       (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t
       .super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
  *(FileInputSource **)
   &((_Var1._M_head_impl)->file).super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2> =
       this_00;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)&(_Var1._M_head_impl)->file + 8),
             &local_38);
  parse(this,password);
  if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
  }
  return;
}

Assistant:

void
QPDF::processFile(char const* description, FILE* filep, bool close_file, char const* password)
{
    auto* fi = new FileInputSource(description, filep, close_file);
    processInputSource(std::shared_ptr<InputSource>(fi), password);
}